

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_simcontext.cpp
# Opt level: O0

uint64 __thiscall sc_core::sc_simcontext::delta_count(sc_simcontext *this)

{
  long in_RDI;
  int in_stack_00000064;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  sc_severity in_stack_00000084;
  
  if (delta_count::warn_delta_count) {
    delta_count::warn_delta_count = false;
    sc_report_handler::report
              (in_stack_00000084,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000064);
  }
  return *(uint64 *)(in_RDI + 0x120);
}

Assistant:

sc_dt::uint64
sc_simcontext::delta_count() const
{
    static bool warn_delta_count=true;
    if ( warn_delta_count )
    {
	warn_delta_count = false;
	SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
	    "sc_simcontext::delta_count() is deprecated, use sc_delta_count()" );
    }
    return m_delta_count;
}